

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::LSTMParams::LSTMParams(LSTMParams *this,LSTMParams *from)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LSTMParams_00344580;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->coupledinputandforgetgate_ = from->coupledinputandforgetgate_;
  bVar2 = from->sequenceoutput_;
  bVar3 = from->hasbiasvectors_;
  bVar4 = from->forgetbias_;
  bVar5 = from->haspeepholevectors_;
  this->cellclipthreshold_ = from->cellclipthreshold_;
  this->sequenceoutput_ = bVar2;
  this->hasbiasvectors_ = bVar3;
  this->forgetbias_ = bVar4;
  this->haspeepholevectors_ = bVar5;
  return;
}

Assistant:

LSTMParams::LSTMParams(const LSTMParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&cellclipthreshold_, &from.cellclipthreshold_,
    reinterpret_cast<char*>(&coupledinputandforgetgate_) -
    reinterpret_cast<char*>(&cellclipthreshold_) + sizeof(coupledinputandforgetgate_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LSTMParams)
}